

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.c
# Opt level: O0

int main(void)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  undefined1 local_30 [8];
  nn_thread thread;
  int s;
  int rc;
  
  thread.handle._4_4_ =
       test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/term.c"
                        ,0x38,1,0x10);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/term.c"
                  ,0x39,thread.handle._4_4_);
  nn_thread_init((nn_thread *)local_30,worker,(void *)0x0);
  nn_sleep(100);
  nn_term();
  iVar1 = nn_socket(1,0x10);
  if (iVar1 != -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == -1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/term.c",
            0x42);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar1 = nn_errno();
  __stream = _stderr;
  if (iVar1 != 0x9523dfd) {
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/term.c",
            0x43);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_thread_term((nn_thread *)local_30);
  return 0;
}

Assistant:

int main ()
{
    int rc;
    int s;
    struct nn_thread thread;

    /*  Close the socket with no associated endpoints. */
    s = test_socket (AF_SP, NN_PAIR);
    test_close (s);

    /*  Test nn_term() before nn_close(). */
    nn_thread_init (&thread, worker, NULL);
    nn_sleep (100);
    nn_term ();

    /*  Check that it's not possible to create new sockets after nn_term(). */
    rc = nn_socket (AF_SP, NN_PAIR);
    nn_assert (rc == -1);
    errno_assert (nn_errno () == ETERM);

    /*  Wait till worker thread terminates. */
    nn_thread_term (&thread);

    return 0;
}